

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *outf;
  
  outf = _stdout;
  initalizeAtomTbl();
  initStdConnTable();
  inputfilename[0] = '\0';
  mainProbeProc(argc,argv,outf);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
   int rc = 0;
   FILE *outf = stdout;

   initalizeAtomTbl(); /*atomprops.c*/
   initStdConnTable(); /*stdconntable.c*/

   inputfilename[0] = '\0'; /*global dcr041023*/
   rc = mainProbeProc(argc, argv, outf);
   return rc;
}